

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array_Data_Types.cc
# Opt level: O1

int __thiscall Array_Data_Symbol::array_allocation(Array_Data_Symbol *this,uint32_t symbol_len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pVVar4;
  pointer this_00;
  
  this->_sym_len = symbol_len;
  this->sym_len = symbol_len;
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::resize
            (&this->symbol,(ulong)this->_L);
  pVVar4 = (this->symbol).super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->symbol).super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar4) {
    uVar3 = 0;
    do {
      this_00 = pVVar4 + uVar3;
      uVar1 = this->_sym_len;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this_00->s,(ulong)uVar1);
      pVVar4[uVar3].d_len = uVar1;
      if ((ulong)uVar1 != 0) {
        uVar2 = 0;
        do {
          (this_00->s).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2] = '\0';
          uVar2 = uVar2 + 1;
        } while (uVar2 < this_00->d_len);
      }
      uVar3 = uVar3 + 1;
      pVVar4 = (this->symbol).super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->symbol).
                                   super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 5));
  }
  return 0;
}

Assistant:

int Array_Data_Symbol::array_allocation(uint32_t symbol_len)
{
	//std::vector< std::vector<uint8_t> > tmp;
	_sym_len = symbol_len;
	sym_len = _sym_len;

	//symbol.resize(_L);

	symbol.resize(_L);

	//symbol[0].allocate_size(symbol_len);
	for (int i = 0; i < symbol.size(); i++)
	{
		symbol[i].allocate_size(_sym_len);
	}

//	std::cout << "IS Numbers : " << symbol.size() << std::endl;

	//symbol_pointer = new class Vector_Data_DEF(symbol_len);


	return 0;
}